

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levinson_durbin_recursion.cc
# Opt level: O1

bool __thiscall
sptk::LevinsonDurbinRecursion::Run
          (LevinsonDurbinRecursion *this,vector<double,_std::allocator<double>_> *autocorrelation,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,bool *is_stable,
          Buffer *buffer)

{
  size_type __new_size;
  uint uVar1;
  double *pdVar2;
  pointer pdVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  double *pdVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (((buffer != (Buffer *)0x0) && (is_stable != (bool *)0x0)) &&
     (linear_predictive_coefficients != (vector<double,_std::allocator<double>_> *)0x0)) {
    uVar1 = this->num_order_;
    __new_size = (long)(int)uVar1 + 1;
    if ((long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == __new_size) {
      if ((long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize
                  (linear_predictive_coefficients,__new_size);
      }
      if ((long)(buffer->c_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->c_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->c_,__new_size);
      }
      *is_stable = true;
      pdVar2 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (buffer->c_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar3 = 0.0;
      dVar12 = *pdVar2;
      if (dVar12 != 0.0) {
        bVar11 = (int)uVar1 < 1;
        if (0 < (int)uVar1) {
          lVar5 = 2;
          uVar8 = 1;
          lVar6 = 0;
          pdVar7 = pdVar4;
          do {
            dVar13 = -pdVar2[uVar8];
            lVar9 = lVar6;
            pdVar10 = pdVar4 + 1;
            if (1 < uVar8) {
              do {
                dVar13 = dVar13 - *pdVar10 * *(double *)((long)pdVar2 + lVar9);
                pdVar10 = pdVar10 + 1;
                lVar9 = lVar9 + -8;
              } while (lVar9 != 0);
            }
            dVar13 = dVar13 / dVar12;
            if (1.0 <= ABS(dVar13)) {
              *is_stable = false;
            }
            if (1 < uVar8) {
              lVar9 = 0;
              pdVar10 = pdVar7;
              do {
                *(double *)((long)pdVar3 + lVar9 + 8) =
                     *pdVar10 * dVar13 + *(double *)((long)(pdVar4 + 1) + lVar9);
                pdVar10 = pdVar10 + -1;
                lVar9 = lVar9 + 8;
              } while (lVar6 != lVar9);
            }
            pdVar3[uVar8] = dVar13;
            dVar12 = dVar12 * (1.0 - dVar13 * dVar13);
            if (dVar12 == 0.0) break;
            lVar9 = 0;
            do {
              pdVar4[lVar9] = pdVar3[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar5 != lVar9);
            bVar11 = (ulong)(long)(int)uVar1 <= uVar8;
            uVar8 = uVar8 + 1;
            lVar5 = lVar5 + 1;
            lVar6 = lVar6 + 8;
            pdVar7 = pdVar7 + 1;
          } while (uVar8 != (ulong)uVar1 + 1);
        }
        if (bVar11) {
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          *pdVar3 = dVar12;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool LevinsonDurbinRecursion::Run(
    const std::vector<double>& autocorrelation,
    std::vector<double>* linear_predictive_coefficients, bool* is_stable,
    LevinsonDurbinRecursion::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      autocorrelation.size() != static_cast<std::size_t>(length) ||
      NULL == linear_predictive_coefficients || NULL == is_stable ||
      NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (linear_predictive_coefficients->size() !=
      static_cast<std::size_t>(length)) {
    linear_predictive_coefficients->resize(length);
  }
  if (buffer->c_.size() != static_cast<std::size_t>(length)) {
    buffer->c_.resize(length);
  }

  *is_stable = true;

  const double* r(&(autocorrelation[0]));
  double* a(&((*linear_predictive_coefficients)[0]));
  double* c(&buffer->c_[0]);

  // Set initial condition.
  a[0] = 0.0;
  double e(r[0]);
  if (0.0 == e || std::isnan(e)) {
    return false;
  }

  // Perform Durbin's iterative algorithm.
  for (int i(1); i < length; ++i) {
    double k(-r[i]);
    for (int j(1); j < i; ++j) {
      k -= c[j] * r[i - j];
    }
    k /= e;

    if (1.0 <= std::fabs(k)) {
      *is_stable = false;
    }

    for (int j(1); j < i; ++j) {
      a[j] = c[j] + k * c[i - j];
    }
    a[i] = k;

    e *= 1.0 - k * k;
    if (0.0 == e || std::isnan(e)) {
      return false;
    }

    for (int j(0); j <= i; ++j) {
      c[j] = a[j];
    }
  }

  // Set gain.
  a[0] = std::sqrt(e);

  return true;
}